

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_153ab3::Db::parseAbiTags(Db *this,Node *N)

{
  bool bVar1;
  undefined1 local_30 [8];
  StringView SN;
  Node *N_local;
  Db *this_local;
  
  SN.Last = (char *)N;
  while( true ) {
    bVar1 = consumeIf(this,'B');
    if (!bVar1) {
      return (Node *)SN.Last;
    }
    _local_30 = parseBareSourceName(this);
    bVar1 = StringView::empty((StringView *)local_30);
    if (bVar1) break;
    SN.Last = (char *)(anonymous_namespace)::Db::
                      make<(anonymous_namespace)::AbiTagAttr,(anonymous_namespace)::Node*&,StringView&>
                                ((Db *)this,(Node **)&SN.Last,(StringView *)local_30);
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseAbiTags(Node *N) {
  while (consumeIf('B')) {
    StringView SN = parseBareSourceName();
    if (SN.empty())
      return nullptr;
    N = make<AbiTagAttr>(N, SN);
  }
  return N;
}